

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

point3 * __thiscall camera::defocus_disk_sample(point3 *__return_storage_ptr__,camera *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vec3 p;
  double local_30;
  double local_28;
  
  random_in_unit_disk();
  dVar1 = (this->defocus_disk_u).e[2];
  dVar2 = (this->center).e[2];
  dVar3 = (this->defocus_disk_v).e[2];
  dVar4 = (this->center).e[1];
  dVar5 = (this->defocus_disk_u).e[1];
  dVar6 = (this->defocus_disk_v).e[1];
  __return_storage_ptr__->e[0] =
       local_28 * (this->defocus_disk_v).e[0] +
       (this->defocus_disk_u).e[0] * local_30 + (this->center).e[0];
  __return_storage_ptr__->e[1] = local_28 * dVar6 + dVar5 * local_30 + dVar4;
  __return_storage_ptr__->e[2] = dVar3 * local_28 + dVar1 * local_30 + dVar2;
  return __return_storage_ptr__;
}

Assistant:

point3 defocus_disk_sample() const {
        // Returns a random point in the camera defocus disk.
        auto p = random_in_unit_disk();
        return center + (p[0] * defocus_disk_u) + (p[1] * defocus_disk_v);
    }